

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O2

void deqp::WriteField(TestLog *log,char *title,string *message)

{
  bool bVar1;
  istream *piVar2;
  string line;
  istringstream tokens;
  
  bVar1 = std::operator==(message,glcts::fixed_sample_locations_values + 1);
  if (!bVar1) {
    std::__cxx11::istringstream::istringstream((istringstream *)&tokens,(string *)message,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    tcu::TestLog::startSection(log,"Details",title);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&tokens,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      tcu::TestLog::writeMessage(log,line._M_dataplus._M_p);
    }
    tcu::TestLog::endSection(log);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&tokens);
  }
  return;
}

Assistant:

void WriteField(tcu::TestLog& log, const char* title, std::string message)
{
	if (message == "")
		return;
	using namespace std;
	using tcu::TestLog;
	istringstream tokens(message);
	string		  line;
	log.startSection("Details", title);
	while (getline(tokens, line))
	{
		log.writeMessage(line.c_str());
	}
	log.endSection();
}